

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

upb_MiniTableField * upb_MiniTable_FindFieldByNumber(upb_MiniTable *m,uint32_t number)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  upb_MiniTableField *puVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  
  uVar3 = (ulong)number - 1;
  uVar5 = (ulong)m->dense_below_dont_copy_me__upb_internal_use_only;
  if (uVar3 < uVar5) {
    if (m->fields_dont_copy_me__upb_internal_use_only[uVar3].
        number_dont_copy_me__upb_internal_use_only != number) {
      __assert_fail("m->fields_dont_copy_me__upb_internal_use_only[i].number_dont_copy_me__upb_internal_use_only == number"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/message.c"
                    ,0x18,
                    "const upb_MiniTableField *upb_MiniTable_FindFieldByNumber(const upb_MiniTable *, uint32_t)"
                   );
    }
    puVar4 = m->fields_dont_copy_me__upb_internal_use_only + uVar3;
  }
  else {
    iVar7 = m->field_count_dont_copy_me__upb_internal_use_only - 1;
    do {
      if (iVar7 < (int)uVar5) {
        return (upb_MiniTableField *)0x0;
      }
      uVar6 = (uint)((int)uVar5 + iVar7) >> 1;
      puVar4 = m->fields_dont_copy_me__upb_internal_use_only + uVar6;
      uVar1 = puVar4->number_dont_copy_me__upb_internal_use_only;
      iVar2 = uVar6 - 1;
      if (number > uVar1 || uVar1 == number) {
        iVar2 = iVar7;
      }
      iVar7 = iVar2;
      uVar3 = (ulong)(uVar6 + 1);
      if (number <= uVar1) {
        uVar3 = uVar5;
      }
      uVar5 = uVar3;
    } while (uVar1 != number);
  }
  return puVar4;
}

Assistant:

const upb_MiniTableField* upb_MiniTable_FindFieldByNumber(
    const upb_MiniTable* m, uint32_t number) {
  const size_t i = ((size_t)number) - 1;  // 0 wraps to SIZE_MAX

  // Ideal case: index into dense fields
  if (i < m->UPB_PRIVATE(dense_below)) {
    UPB_ASSERT(m->UPB_PRIVATE(fields)[i].UPB_PRIVATE(number) == number);
    return &m->UPB_PRIVATE(fields)[i];
  }

  // Slow case: binary search
  uint32_t lo = m->UPB_PRIVATE(dense_below);
  int32_t hi = m->UPB_PRIVATE(field_count) - 1;
  const upb_MiniTableField* base = m->UPB_PRIVATE(fields);
  while (hi >= (int32_t)lo) {
    uint32_t mid = (hi + lo) / 2;
    uint32_t num = base[mid].UPB_ONLYBITS(number);
    // These comparison operations allow, on ARM machines, to fuse all these
    // branches into one comparison followed by two CSELs to set the lo/hi
    // values, followed by a BNE to continue or terminate the loop. Since binary
    // search branches are generally unpredictable (50/50 in each direction),
    // this is a good deal. We use signed for the high, as this decrement may
    // underflow if mid is 0.
    int32_t hi_mid = mid - 1;
    uint32_t lo_mid = mid + 1;
    if (num == number) {
      return &base[mid];
    }
    if (UPB_UNPREDICTABLE(num < number)) {
      lo = lo_mid;
    } else {
      hi = hi_mid;
    }
  }

  return NULL;
}